

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O2

void __thiscall Graph::update_edge(Graph *this,string *begin,string *end,double weight)

{
  pointer pGVar1;
  bool bVar2;
  __type _Var3;
  GNode *pGVar4;
  GNode *__rhs;
  ostream *poVar5;
  GEdge *edge;
  pointer pGVar6;
  
  bVar2 = search(this,begin);
  if (bVar2) {
    pGVar4 = get_node(this,begin);
    bVar2 = search(this,end);
    begin = end;
    if (bVar2) {
      __rhs = get_node(this,end);
      pGVar1 = (pGVar4->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pGVar6 = (pGVar4->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start; pGVar6 != pGVar1; pGVar6 = pGVar6 + 1)
      {
        _Var3 = std::operator==(&pGVar6->node->name,&__rhs->name);
        if (_Var3) {
          pGVar6->weight = weight;
        }
      }
      return;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Error: no node \"");
  poVar5 = std::operator<<(poVar5,(string *)begin);
  std::operator<<(poVar5,"\" exists \n");
  return;
}

Assistant:

void Graph::update_edge(const std::string &begin, const std::string &end, double weight) {
    if (search(begin)) {
        GNode *origin = get_node(begin);
        GNode *dest;

        if (search(end)) {
            dest = get_node(end);
            for (auto & edge : origin->edges) {
                if (edge.node->name == dest->name) {
                    edge.weight = weight;
                }
            }
        } else {
            cout << "Error: no node \"" << end << "\" exists \n";
        }
    } else {
        cout << "Error: no node \"" << begin << "\" exists \n";
    }
}